

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.h
# Opt level: O1

void __thiscall DSDcc::DSDDstar::DStarHeader::~DStarHeader(DStarHeader *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->m_mySign)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_mySign).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_yourSign)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_yourSign).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_rpt2)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_rpt2).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_rpt1)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_rpt1).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

void clear()
       {
           m_rpt1.clear();
           m_rpt2.clear();
           m_yourSign.clear();
           m_mySign.clear();
           m_rpt1FromHD = false;
           m_rpt2FromHD = false;
           m_yourSignFromHD = false;
           m_mySignFromHD = false;
       }